

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void caffe::protobuf_caffe_2eproto::TableStruct::InitDefaultsImpl(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  BlobShape *pBVar2;
  BlobProto *pBVar3;
  NetState *pNVar4;
  NetParameter *pNVar5;
  SolverParameter *pSVar6;
  TransformationParameter *pTVar7;
  LayerParameter *pLVar8;
  LossParameter *pLVar9;
  AccuracyParameter *pAVar10;
  ArgMaxParameter *pAVar11;
  BatchNormParameter *pBVar12;
  BiasParameter *pBVar13;
  ConcatParameter *pCVar14;
  ContrastiveLossParameter *pCVar15;
  ConvolutionParameter *pCVar16;
  CropParameter *pCVar17;
  DataParameter *pDVar18;
  DropoutParameter *pDVar19;
  DummyDataParameter *pDVar20;
  EltwiseParameter *pEVar21;
  ELUParameter *pEVar22;
  EmbedParameter *pEVar23;
  ExpParameter *pEVar24;
  FlattenParameter *pFVar25;
  HDF5DataParameter *pHVar26;
  HDF5OutputParameter *pHVar27;
  HingeLossParameter *pHVar28;
  ImageDataParameter *pIVar29;
  InfogainLossParameter *pIVar30;
  InnerProductParameter *pIVar31;
  InputParameter *pIVar32;
  LogParameter *pLVar33;
  LRNParameter *pLVar34;
  MemoryDataParameter *pMVar35;
  MVNParameter *pMVar36;
  ParameterParameter *pPVar37;
  PoolingParameter *pPVar38;
  PowerParameter *pPVar39;
  PReLUParameter *pPVar40;
  PythonParameter *pPVar41;
  RecurrentParameter *pRVar42;
  ReductionParameter *pRVar43;
  ReLUParameter *pRVar44;
  ReshapeParameter *pRVar45;
  ScaleParameter *pSVar46;
  SigmoidParameter *pSVar47;
  SoftmaxParameter *pSVar48;
  SPPParameter *pSVar49;
  SliceParameter *pSVar50;
  TanHParameter *pTVar51;
  ThresholdParameter *pTVar52;
  TileParameter *pTVar53;
  WindowDataParameter *pWVar54;
  FillerParameter *pFVar55;
  V1LayerParameter *pVVar56;
  V0LayerParameter *pVVar57;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobShape>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::BlobShape> *)_BlobShape_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobProto>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::BlobProto> *)_BlobProto_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::BlobProtoVector>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::BlobProtoVector> *)_BlobProtoVector_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::Datum>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::Datum> *)_Datum_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::DefaultConstruct((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)FillerParameter::_default_type__abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"constant",8,&local_29);
  pbVar1 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)FillerParameter::_default_type__abi_cxx11_);
  std::__cxx11::string::operator=((string *)pbVar1,local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  google::protobuf::internal::ExplicitlyConstructed<caffe::FillerParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::FillerParameter> *)_FillerParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::NetParameter> *)_NetParameter_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::DefaultConstruct((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)SolverParameter::_default_regularization_type__abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"L2",2,&local_61);
  pbVar1 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)SolverParameter::_default_regularization_type__abi_cxx11_);
  std::__cxx11::string::operator=((string *)pbVar1,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::DefaultConstruct((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)SolverParameter::_default_type__abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"SGD",3,&local_89);
  pbVar1 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)SolverParameter::_default_type__abi_cxx11_);
  std::__cxx11::string::operator=((string *)pbVar1,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SolverParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SolverParameter> *)_SolverParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SolverState>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SolverState> *)_SolverState_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetState>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::NetState> *)_NetState_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::NetStateRule>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::NetStateRule> *)_NetStateRule_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ParamSpec>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ParamSpec> *)_ParamSpec_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::LayerParameter> *)_LayerParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::TransformationParameter>::
  DefaultConstruct((ExplicitlyConstructed<caffe::TransformationParameter> *)
                   _TransformationParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::LossParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::LossParameter> *)_LossParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::AccuracyParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::AccuracyParameter> *)_AccuracyParameter_default_instance_
            );
  google::protobuf::internal::ExplicitlyConstructed<caffe::ArgMaxParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ArgMaxParameter> *)_ArgMaxParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ConcatParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ConcatParameter> *)_ConcatParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::BatchNormParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::BatchNormParameter> *)
             _BatchNormParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::BiasParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::BiasParameter> *)_BiasParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ContrastiveLossParameter>::
  DefaultConstruct((ExplicitlyConstructed<caffe::ContrastiveLossParameter> *)
                   _ContrastiveLossParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ConvolutionParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ConvolutionParameter> *)
             _ConvolutionParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::CropParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::CropParameter> *)_CropParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::DataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::DataParameter> *)_DataParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::DropoutParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::DropoutParameter> *)_DropoutParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::DummyDataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::DummyDataParameter> *)
             _DummyDataParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::EltwiseParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::EltwiseParameter> *)_EltwiseParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ELUParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ELUParameter> *)_ELUParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::EmbedParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::EmbedParameter> *)_EmbedParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ExpParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ExpParameter> *)_ExpParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::FlattenParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::FlattenParameter> *)_FlattenParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::HDF5DataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::HDF5DataParameter> *)_HDF5DataParameter_default_instance_
            );
  google::protobuf::internal::ExplicitlyConstructed<caffe::HDF5OutputParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::HDF5OutputParameter> *)
             _HDF5OutputParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::HingeLossParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::HingeLossParameter> *)
             _HingeLossParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ImageDataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ImageDataParameter> *)
             _ImageDataParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::InfogainLossParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::InfogainLossParameter> *)
             _InfogainLossParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::InnerProductParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::InnerProductParameter> *)
             _InnerProductParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::InputParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::InputParameter> *)_InputParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::LogParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::LogParameter> *)_LogParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::LRNParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::LRNParameter> *)_LRNParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::MemoryDataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::MemoryDataParameter> *)
             _MemoryDataParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::MVNParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::MVNParameter> *)_MVNParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ParameterParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ParameterParameter> *)
             _ParameterParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::PoolingParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::PoolingParameter> *)_PoolingParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::PowerParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::PowerParameter> *)_PowerParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::PythonParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::PythonParameter> *)_PythonParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::RecurrentParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::RecurrentParameter> *)
             _RecurrentParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReductionParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ReductionParameter> *)
             _ReductionParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReLUParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ReLUParameter> *)_ReLUParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ReshapeParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ReshapeParameter> *)_ReshapeParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ScaleParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ScaleParameter> *)_ScaleParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SigmoidParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SigmoidParameter> *)_SigmoidParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SliceParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SliceParameter> *)_SliceParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SoftmaxParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SoftmaxParameter> *)_SoftmaxParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::TanHParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::TanHParameter> *)_TanHParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::TileParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::TileParameter> *)_TileParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::ThresholdParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::ThresholdParameter> *)
             _ThresholdParameter_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::DefaultConstruct((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)WindowDataParameter::_default_crop_mode__abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"warp",4,&local_b1);
  pbVar1 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)WindowDataParameter::_default_crop_mode__abi_cxx11_);
  std::__cxx11::string::operator=((string *)pbVar1,local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  google::protobuf::internal::ExplicitlyConstructed<caffe::WindowDataParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::WindowDataParameter> *)
             _WindowDataParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::SPPParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::SPPParameter> *)_SPPParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::V1LayerParameter> *)_V1LayerParameter_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::DefaultConstruct((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)V0LayerParameter::_default_det_crop_mode__abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"warp",4,&local_d9);
  pbVar1 = google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)V0LayerParameter::_default_det_crop_mode__abi_cxx11_);
  std::__cxx11::string::operator=((string *)pbVar1,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  google::protobuf::internal::ExplicitlyConstructed<caffe::V0LayerParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::V0LayerParameter> *)_V0LayerParameter_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<caffe::PReLUParameter>::DefaultConstruct
            ((ExplicitlyConstructed<caffe::PReLUParameter> *)_PReLUParameter_default_instance_);
  pBVar2 = BlobShape::internal_default_instance();
  pBVar3 = google::protobuf::internal::ExplicitlyConstructed<caffe::BlobProto>::get_mutable
                     ((ExplicitlyConstructed<caffe::BlobProto> *)_BlobProto_default_instance_);
  pBVar3->shape_ = pBVar2;
  pNVar4 = NetState::internal_default_instance();
  pNVar5 = google::protobuf::internal::ExplicitlyConstructed<caffe::NetParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::NetParameter> *)_NetParameter_default_instance_)
  ;
  pNVar5->state_ = pNVar4;
  pNVar5 = NetParameter::internal_default_instance();
  pSVar6 = google::protobuf::internal::ExplicitlyConstructed<caffe::SolverParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::SolverParameter> *)
                      _SolverParameter_default_instance_);
  pSVar6->net_param_ = pNVar5;
  pNVar5 = NetParameter::internal_default_instance();
  pSVar6 = google::protobuf::internal::ExplicitlyConstructed<caffe::SolverParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::SolverParameter> *)
                      _SolverParameter_default_instance_);
  pSVar6->train_net_param_ = pNVar5;
  pNVar4 = NetState::internal_default_instance();
  pSVar6 = google::protobuf::internal::ExplicitlyConstructed<caffe::SolverParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::SolverParameter> *)
                      _SolverParameter_default_instance_);
  pSVar6->train_state_ = pNVar4;
  pTVar7 = TransformationParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->transform_param_ = pTVar7;
  pLVar9 = LossParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->loss_param_ = pLVar9;
  pAVar10 = AccuracyParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->accuracy_param_ = pAVar10;
  pAVar11 = ArgMaxParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->argmax_param_ = pAVar11;
  pBVar12 = BatchNormParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->batch_norm_param_ = pBVar12;
  pBVar13 = BiasParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->bias_param_ = pBVar13;
  pCVar14 = ConcatParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->concat_param_ = pCVar14;
  pCVar15 = ContrastiveLossParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->contrastive_loss_param_ = pCVar15;
  pCVar16 = ConvolutionParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->convolution_param_ = pCVar16;
  pCVar17 = CropParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->crop_param_ = pCVar17;
  pDVar18 = DataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->data_param_ = pDVar18;
  pDVar19 = DropoutParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->dropout_param_ = pDVar19;
  pDVar20 = DummyDataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->dummy_data_param_ = pDVar20;
  pEVar21 = EltwiseParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->eltwise_param_ = pEVar21;
  pEVar22 = ELUParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->elu_param_ = pEVar22;
  pEVar23 = EmbedParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->embed_param_ = pEVar23;
  pEVar24 = ExpParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->exp_param_ = pEVar24;
  pFVar25 = FlattenParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->flatten_param_ = pFVar25;
  pHVar26 = HDF5DataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->hdf5_data_param_ = pHVar26;
  pHVar27 = HDF5OutputParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->hdf5_output_param_ = pHVar27;
  pHVar28 = HingeLossParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->hinge_loss_param_ = pHVar28;
  pIVar29 = ImageDataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->image_data_param_ = pIVar29;
  pIVar30 = InfogainLossParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->infogain_loss_param_ = pIVar30;
  pIVar31 = InnerProductParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->inner_product_param_ = pIVar31;
  pIVar32 = InputParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->input_param_ = pIVar32;
  pLVar33 = LogParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->log_param_ = pLVar33;
  pLVar34 = LRNParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->lrn_param_ = pLVar34;
  pMVar35 = MemoryDataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->memory_data_param_ = pMVar35;
  pMVar36 = MVNParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->mvn_param_ = pMVar36;
  pPVar37 = ParameterParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->parameter_param_ = pPVar37;
  pPVar38 = PoolingParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->pooling_param_ = pPVar38;
  pPVar39 = PowerParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->power_param_ = pPVar39;
  pPVar40 = PReLUParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->prelu_param_ = pPVar40;
  pPVar41 = PythonParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->python_param_ = pPVar41;
  pRVar42 = RecurrentParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->recurrent_param_ = pRVar42;
  pRVar43 = ReductionParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->reduction_param_ = pRVar43;
  pRVar44 = ReLUParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->relu_param_ = pRVar44;
  pRVar45 = ReshapeParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->reshape_param_ = pRVar45;
  pSVar46 = ScaleParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->scale_param_ = pSVar46;
  pSVar47 = SigmoidParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->sigmoid_param_ = pSVar47;
  pSVar48 = SoftmaxParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->softmax_param_ = pSVar48;
  pSVar49 = SPPParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->spp_param_ = pSVar49;
  pSVar50 = SliceParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->slice_param_ = pSVar50;
  pTVar51 = TanHParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->tanh_param_ = pTVar51;
  pTVar52 = ThresholdParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->threshold_param_ = pTVar52;
  pTVar53 = TileParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->tile_param_ = pTVar53;
  pWVar54 = WindowDataParameter::internal_default_instance();
  pLVar8 = google::protobuf::internal::ExplicitlyConstructed<caffe::LayerParameter>::get_mutable
                     ((ExplicitlyConstructed<caffe::LayerParameter> *)
                      _LayerParameter_default_instance_);
  pLVar8->window_data_param_ = pWVar54;
  pFVar55 = FillerParameter::internal_default_instance();
  pBVar13 = google::protobuf::internal::ExplicitlyConstructed<caffe::BiasParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::BiasParameter> *)
                       _BiasParameter_default_instance_);
  pBVar13->filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pCVar16 = google::protobuf::internal::ExplicitlyConstructed<caffe::ConvolutionParameter>::
            get_mutable((ExplicitlyConstructed<caffe::ConvolutionParameter> *)
                        _ConvolutionParameter_default_instance_);
  pCVar16->weight_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pCVar16 = google::protobuf::internal::ExplicitlyConstructed<caffe::ConvolutionParameter>::
            get_mutable((ExplicitlyConstructed<caffe::ConvolutionParameter> *)
                        _ConvolutionParameter_default_instance_);
  pCVar16->bias_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pEVar23 = google::protobuf::internal::ExplicitlyConstructed<caffe::EmbedParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::EmbedParameter> *)
                       _EmbedParameter_default_instance_);
  pEVar23->weight_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pEVar23 = google::protobuf::internal::ExplicitlyConstructed<caffe::EmbedParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::EmbedParameter> *)
                       _EmbedParameter_default_instance_);
  pEVar23->bias_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pIVar31 = google::protobuf::internal::ExplicitlyConstructed<caffe::InnerProductParameter>::
            get_mutable((ExplicitlyConstructed<caffe::InnerProductParameter> *)
                        _InnerProductParameter_default_instance_);
  pIVar31->weight_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pIVar31 = google::protobuf::internal::ExplicitlyConstructed<caffe::InnerProductParameter>::
            get_mutable((ExplicitlyConstructed<caffe::InnerProductParameter> *)
                        _InnerProductParameter_default_instance_);
  pIVar31->bias_filler_ = pFVar55;
  pBVar2 = BlobShape::internal_default_instance();
  pPVar37 = google::protobuf::internal::ExplicitlyConstructed<caffe::ParameterParameter>::
            get_mutable((ExplicitlyConstructed<caffe::ParameterParameter> *)
                        _ParameterParameter_default_instance_);
  pPVar37->shape_ = pBVar2;
  pFVar55 = FillerParameter::internal_default_instance();
  pRVar42 = google::protobuf::internal::ExplicitlyConstructed<caffe::RecurrentParameter>::
            get_mutable((ExplicitlyConstructed<caffe::RecurrentParameter> *)
                        _RecurrentParameter_default_instance_);
  pRVar42->weight_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pRVar42 = google::protobuf::internal::ExplicitlyConstructed<caffe::RecurrentParameter>::
            get_mutable((ExplicitlyConstructed<caffe::RecurrentParameter> *)
                        _RecurrentParameter_default_instance_);
  pRVar42->bias_filler_ = pFVar55;
  pBVar2 = BlobShape::internal_default_instance();
  pRVar45 = google::protobuf::internal::ExplicitlyConstructed<caffe::ReshapeParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::ReshapeParameter> *)
                       _ReshapeParameter_default_instance_);
  pRVar45->shape_ = pBVar2;
  pFVar55 = FillerParameter::internal_default_instance();
  pSVar46 = google::protobuf::internal::ExplicitlyConstructed<caffe::ScaleParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::ScaleParameter> *)
                       _ScaleParameter_default_instance_);
  pSVar46->filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pSVar46 = google::protobuf::internal::ExplicitlyConstructed<caffe::ScaleParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::ScaleParameter> *)
                       _ScaleParameter_default_instance_);
  pSVar46->bias_filler_ = pFVar55;
  pAVar10 = AccuracyParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->accuracy_param_ = pAVar10;
  pAVar11 = ArgMaxParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->argmax_param_ = pAVar11;
  pCVar14 = ConcatParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->concat_param_ = pCVar14;
  pCVar15 = ContrastiveLossParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->contrastive_loss_param_ = pCVar15;
  pCVar16 = ConvolutionParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->convolution_param_ = pCVar16;
  pDVar18 = DataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->data_param_ = pDVar18;
  pDVar19 = DropoutParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->dropout_param_ = pDVar19;
  pDVar20 = DummyDataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->dummy_data_param_ = pDVar20;
  pEVar21 = EltwiseParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->eltwise_param_ = pEVar21;
  pEVar24 = ExpParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->exp_param_ = pEVar24;
  pHVar26 = HDF5DataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->hdf5_data_param_ = pHVar26;
  pHVar27 = HDF5OutputParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->hdf5_output_param_ = pHVar27;
  pHVar28 = HingeLossParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->hinge_loss_param_ = pHVar28;
  pIVar29 = ImageDataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->image_data_param_ = pIVar29;
  pIVar30 = InfogainLossParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->infogain_loss_param_ = pIVar30;
  pIVar31 = InnerProductParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->inner_product_param_ = pIVar31;
  pLVar34 = LRNParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->lrn_param_ = pLVar34;
  pMVar35 = MemoryDataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->memory_data_param_ = pMVar35;
  pMVar36 = MVNParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->mvn_param_ = pMVar36;
  pPVar38 = PoolingParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->pooling_param_ = pPVar38;
  pPVar39 = PowerParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->power_param_ = pPVar39;
  pRVar44 = ReLUParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->relu_param_ = pRVar44;
  pSVar47 = SigmoidParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->sigmoid_param_ = pSVar47;
  pSVar48 = SoftmaxParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->softmax_param_ = pSVar48;
  pSVar50 = SliceParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->slice_param_ = pSVar50;
  pTVar51 = TanHParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->tanh_param_ = pTVar51;
  pTVar52 = ThresholdParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->threshold_param_ = pTVar52;
  pWVar54 = WindowDataParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->window_data_param_ = pWVar54;
  pTVar7 = TransformationParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->transform_param_ = pTVar7;
  pLVar9 = LossParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->loss_param_ = pLVar9;
  pVVar57 = V0LayerParameter::internal_default_instance();
  pVVar56 = google::protobuf::internal::ExplicitlyConstructed<caffe::V1LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V1LayerParameter> *)
                       _V1LayerParameter_default_instance_);
  pVVar56->layer_ = pVVar57;
  pFVar55 = FillerParameter::internal_default_instance();
  pVVar57 = google::protobuf::internal::ExplicitlyConstructed<caffe::V0LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V0LayerParameter> *)
                       _V0LayerParameter_default_instance_);
  pVVar57->weight_filler_ = pFVar55;
  pFVar55 = FillerParameter::internal_default_instance();
  pVVar57 = google::protobuf::internal::ExplicitlyConstructed<caffe::V0LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V0LayerParameter> *)
                       _V0LayerParameter_default_instance_);
  pVVar57->bias_filler_ = pFVar55;
  pHVar27 = HDF5OutputParameter::internal_default_instance();
  pVVar57 = google::protobuf::internal::ExplicitlyConstructed<caffe::V0LayerParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::V0LayerParameter> *)
                       _V0LayerParameter_default_instance_);
  pVVar57->hdf5_output_param_ = pHVar27;
  pFVar55 = FillerParameter::internal_default_instance();
  pPVar40 = google::protobuf::internal::ExplicitlyConstructed<caffe::PReLUParameter>::get_mutable
                      ((ExplicitlyConstructed<caffe::PReLUParameter> *)
                       _PReLUParameter_default_instance_);
  pPVar40->filler_ = pFVar55;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BlobShape_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.DefaultConstruct();
  _BlobProtoVector_default_instance_.DefaultConstruct();
  _Datum_default_instance_.DefaultConstruct();
  FillerParameter::_default_type_.DefaultConstruct();
  *FillerParameter::_default_type_.get_mutable() = ::std::string("constant", 8);
  _FillerParameter_default_instance_.DefaultConstruct();
  _NetParameter_default_instance_.DefaultConstruct();
  SolverParameter::_default_regularization_type_.DefaultConstruct();
  *SolverParameter::_default_regularization_type_.get_mutable() = ::std::string("L2", 2);
  SolverParameter::_default_type_.DefaultConstruct();
  *SolverParameter::_default_type_.get_mutable() = ::std::string("SGD", 3);
  _SolverParameter_default_instance_.DefaultConstruct();
  _SolverState_default_instance_.DefaultConstruct();
  _NetState_default_instance_.DefaultConstruct();
  _NetStateRule_default_instance_.DefaultConstruct();
  _ParamSpec_default_instance_.DefaultConstruct();
  _LayerParameter_default_instance_.DefaultConstruct();
  _TransformationParameter_default_instance_.DefaultConstruct();
  _LossParameter_default_instance_.DefaultConstruct();
  _AccuracyParameter_default_instance_.DefaultConstruct();
  _ArgMaxParameter_default_instance_.DefaultConstruct();
  _ConcatParameter_default_instance_.DefaultConstruct();
  _BatchNormParameter_default_instance_.DefaultConstruct();
  _BiasParameter_default_instance_.DefaultConstruct();
  _ContrastiveLossParameter_default_instance_.DefaultConstruct();
  _ConvolutionParameter_default_instance_.DefaultConstruct();
  _CropParameter_default_instance_.DefaultConstruct();
  _DataParameter_default_instance_.DefaultConstruct();
  _DropoutParameter_default_instance_.DefaultConstruct();
  _DummyDataParameter_default_instance_.DefaultConstruct();
  _EltwiseParameter_default_instance_.DefaultConstruct();
  _ELUParameter_default_instance_.DefaultConstruct();
  _EmbedParameter_default_instance_.DefaultConstruct();
  _ExpParameter_default_instance_.DefaultConstruct();
  _FlattenParameter_default_instance_.DefaultConstruct();
  _HDF5DataParameter_default_instance_.DefaultConstruct();
  _HDF5OutputParameter_default_instance_.DefaultConstruct();
  _HingeLossParameter_default_instance_.DefaultConstruct();
  _ImageDataParameter_default_instance_.DefaultConstruct();
  _InfogainLossParameter_default_instance_.DefaultConstruct();
  _InnerProductParameter_default_instance_.DefaultConstruct();
  _InputParameter_default_instance_.DefaultConstruct();
  _LogParameter_default_instance_.DefaultConstruct();
  _LRNParameter_default_instance_.DefaultConstruct();
  _MemoryDataParameter_default_instance_.DefaultConstruct();
  _MVNParameter_default_instance_.DefaultConstruct();
  _ParameterParameter_default_instance_.DefaultConstruct();
  _PoolingParameter_default_instance_.DefaultConstruct();
  _PowerParameter_default_instance_.DefaultConstruct();
  _PythonParameter_default_instance_.DefaultConstruct();
  _RecurrentParameter_default_instance_.DefaultConstruct();
  _ReductionParameter_default_instance_.DefaultConstruct();
  _ReLUParameter_default_instance_.DefaultConstruct();
  _ReshapeParameter_default_instance_.DefaultConstruct();
  _ScaleParameter_default_instance_.DefaultConstruct();
  _SigmoidParameter_default_instance_.DefaultConstruct();
  _SliceParameter_default_instance_.DefaultConstruct();
  _SoftmaxParameter_default_instance_.DefaultConstruct();
  _TanHParameter_default_instance_.DefaultConstruct();
  _TileParameter_default_instance_.DefaultConstruct();
  _ThresholdParameter_default_instance_.DefaultConstruct();
  WindowDataParameter::_default_crop_mode_.DefaultConstruct();
  *WindowDataParameter::_default_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _WindowDataParameter_default_instance_.DefaultConstruct();
  _SPPParameter_default_instance_.DefaultConstruct();
  _V1LayerParameter_default_instance_.DefaultConstruct();
  V0LayerParameter::_default_det_crop_mode_.DefaultConstruct();
  *V0LayerParameter::_default_det_crop_mode_.get_mutable() = ::std::string("warp", 4);
  _V0LayerParameter_default_instance_.DefaultConstruct();
  _PReLUParameter_default_instance_.DefaultConstruct();
  _BlobProto_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _NetParameter_default_instance_.get_mutable()->state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_net_param_ = const_cast< ::caffe::NetParameter*>(
      ::caffe::NetParameter::internal_default_instance());
  _SolverParameter_default_instance_.get_mutable()->train_state_ = const_cast< ::caffe::NetState*>(
      ::caffe::NetState::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->batch_norm_param_ = const_cast< ::caffe::BatchNormParameter*>(
      ::caffe::BatchNormParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->bias_param_ = const_cast< ::caffe::BiasParameter*>(
      ::caffe::BiasParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->crop_param_ = const_cast< ::caffe::CropParameter*>(
      ::caffe::CropParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->elu_param_ = const_cast< ::caffe::ELUParameter*>(
      ::caffe::ELUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->embed_param_ = const_cast< ::caffe::EmbedParameter*>(
      ::caffe::EmbedParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->flatten_param_ = const_cast< ::caffe::FlattenParameter*>(
      ::caffe::FlattenParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->input_param_ = const_cast< ::caffe::InputParameter*>(
      ::caffe::InputParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->log_param_ = const_cast< ::caffe::LogParameter*>(
      ::caffe::LogParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->parameter_param_ = const_cast< ::caffe::ParameterParameter*>(
      ::caffe::ParameterParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->prelu_param_ = const_cast< ::caffe::PReLUParameter*>(
      ::caffe::PReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->python_param_ = const_cast< ::caffe::PythonParameter*>(
      ::caffe::PythonParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->recurrent_param_ = const_cast< ::caffe::RecurrentParameter*>(
      ::caffe::RecurrentParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reduction_param_ = const_cast< ::caffe::ReductionParameter*>(
      ::caffe::ReductionParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->reshape_param_ = const_cast< ::caffe::ReshapeParameter*>(
      ::caffe::ReshapeParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->scale_param_ = const_cast< ::caffe::ScaleParameter*>(
      ::caffe::ScaleParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->spp_param_ = const_cast< ::caffe::SPPParameter*>(
      ::caffe::SPPParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->tile_param_ = const_cast< ::caffe::TileParameter*>(
      ::caffe::TileParameter::internal_default_instance());
  _LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _BiasParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ConvolutionParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _EmbedParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _InnerProductParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ParameterParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _RecurrentParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ReshapeParameter_default_instance_.get_mutable()->shape_ = const_cast< ::caffe::BlobShape*>(
      ::caffe::BlobShape::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _ScaleParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->accuracy_param_ = const_cast< ::caffe::AccuracyParameter*>(
      ::caffe::AccuracyParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->argmax_param_ = const_cast< ::caffe::ArgMaxParameter*>(
      ::caffe::ArgMaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->concat_param_ = const_cast< ::caffe::ConcatParameter*>(
      ::caffe::ConcatParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->contrastive_loss_param_ = const_cast< ::caffe::ContrastiveLossParameter*>(
      ::caffe::ContrastiveLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->convolution_param_ = const_cast< ::caffe::ConvolutionParameter*>(
      ::caffe::ConvolutionParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->data_param_ = const_cast< ::caffe::DataParameter*>(
      ::caffe::DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dropout_param_ = const_cast< ::caffe::DropoutParameter*>(
      ::caffe::DropoutParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->dummy_data_param_ = const_cast< ::caffe::DummyDataParameter*>(
      ::caffe::DummyDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->eltwise_param_ = const_cast< ::caffe::EltwiseParameter*>(
      ::caffe::EltwiseParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->exp_param_ = const_cast< ::caffe::ExpParameter*>(
      ::caffe::ExpParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_data_param_ = const_cast< ::caffe::HDF5DataParameter*>(
      ::caffe::HDF5DataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->hinge_loss_param_ = const_cast< ::caffe::HingeLossParameter*>(
      ::caffe::HingeLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->image_data_param_ = const_cast< ::caffe::ImageDataParameter*>(
      ::caffe::ImageDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->infogain_loss_param_ = const_cast< ::caffe::InfogainLossParameter*>(
      ::caffe::InfogainLossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->inner_product_param_ = const_cast< ::caffe::InnerProductParameter*>(
      ::caffe::InnerProductParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->lrn_param_ = const_cast< ::caffe::LRNParameter*>(
      ::caffe::LRNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->memory_data_param_ = const_cast< ::caffe::MemoryDataParameter*>(
      ::caffe::MemoryDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->mvn_param_ = const_cast< ::caffe::MVNParameter*>(
      ::caffe::MVNParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->pooling_param_ = const_cast< ::caffe::PoolingParameter*>(
      ::caffe::PoolingParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->power_param_ = const_cast< ::caffe::PowerParameter*>(
      ::caffe::PowerParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->relu_param_ = const_cast< ::caffe::ReLUParameter*>(
      ::caffe::ReLUParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->sigmoid_param_ = const_cast< ::caffe::SigmoidParameter*>(
      ::caffe::SigmoidParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->softmax_param_ = const_cast< ::caffe::SoftmaxParameter*>(
      ::caffe::SoftmaxParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->slice_param_ = const_cast< ::caffe::SliceParameter*>(
      ::caffe::SliceParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->tanh_param_ = const_cast< ::caffe::TanHParameter*>(
      ::caffe::TanHParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->threshold_param_ = const_cast< ::caffe::ThresholdParameter*>(
      ::caffe::ThresholdParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->window_data_param_ = const_cast< ::caffe::WindowDataParameter*>(
      ::caffe::WindowDataParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->transform_param_ = const_cast< ::caffe::TransformationParameter*>(
      ::caffe::TransformationParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->loss_param_ = const_cast< ::caffe::LossParameter*>(
      ::caffe::LossParameter::internal_default_instance());
  _V1LayerParameter_default_instance_.get_mutable()->layer_ = const_cast< ::caffe::V0LayerParameter*>(
      ::caffe::V0LayerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->weight_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->bias_filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
  _V0LayerParameter_default_instance_.get_mutable()->hdf5_output_param_ = const_cast< ::caffe::HDF5OutputParameter*>(
      ::caffe::HDF5OutputParameter::internal_default_instance());
  _PReLUParameter_default_instance_.get_mutable()->filler_ = const_cast< ::caffe::FillerParameter*>(
      ::caffe::FillerParameter::internal_default_instance());
}